

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

int flatcc_json_printer_init(flatcc_json_printer_t *ctx,void *fp)

{
  int iVar1;
  char *pcVar2;
  
  ctx->fp = (void *)0x0;
  ctx->flush = (flatcc_json_printer_flush_f *)0x0;
  ctx->own_buffer = '\0';
  ctx->indent = '\0';
  ctx->unquote = '\0';
  ctx->noenum = '\0';
  ctx->skip_default = '\0';
  ctx->force_default = '\0';
  *(undefined2 *)&ctx->field_0x36 = 0;
  ctx->level = 0;
  ctx->error = 0;
  ctx->pflush = (char *)0x0;
  ctx->p = (char *)0x0;
  ctx->flush_size = 0;
  ctx->total = 0;
  ctx->buf = (char *)0x0;
  ctx->size = 0;
  if (fp == (void *)0x0) {
    fp = _stdout;
  }
  ctx->fp = fp;
  ctx->flush = __flatcc_json_printer_flush;
  pcVar2 = (char *)malloc(0x4040);
  ctx->buf = pcVar2;
  if (pcVar2 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    ctx->own_buffer = '\x01';
    ctx->size = 0x4040;
    ctx->flush_size = 0x4000;
    ctx->p = pcVar2;
    ctx->pflush = pcVar2 + 0x4000;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int flatcc_json_printer_init(flatcc_json_printer_t *ctx, void *fp)
{
    memset(ctx, 0, sizeof(*ctx));
    ctx->fp = fp ? fp : stdout;
    ctx->flush = __flatcc_json_printer_flush;
    if (!(ctx->buf = FLATCC_JSON_PRINTER_ALLOC(FLATCC_JSON_PRINT_BUFFER_SIZE))) {
        return -1;
    }
    ctx->own_buffer = 1;
    ctx->size = FLATCC_JSON_PRINT_BUFFER_SIZE;
    ctx->flush_size = FLATCC_JSON_PRINT_FLUSH_SIZE;
    ctx->p = ctx->buf;
    ctx->pflush = ctx->buf + ctx->flush_size;
    /*
     * Make sure we have space for primitive operations such as printing numbers
     * without having to flush.
     */
    FLATCC_ASSERT(ctx->flush_size + FLATCC_JSON_PRINT_RESERVE <= ctx->size);
    return 0;
}